

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O2

_Bool obj_known_damage(object *obj,int *normal_damage,int *brand_damage,int *slay_damage,
                      _Bool *nonweap_slay,_Bool throw)

{
  byte bVar1;
  wchar_t wVar2;
  critical_level *pcVar3;
  _Bool *source;
  angband_constants *paVar4;
  player *ppVar5;
  player *ppVar6;
  _Bool _Var7;
  bool bVar8;
  _Bool _Var9;
  int16_t iVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  int iVar13;
  object *poVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  bool bVar18;
  wchar_t wVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  critical_level *pcVar23;
  wchar_t wVar24;
  ulong uVar25;
  player_state_conflict *state_00;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  wchar_t local_1bc;
  wchar_t crit_round_mult;
  wchar_t crit_add;
  wchar_t crit_mult;
  _Bool *local_1a0;
  wchar_t local_194;
  wchar_t crit_round_add;
  wchar_t crit_div;
  _Bool *total_slays;
  wchar_t crit_scl_round;
  player *local_178;
  _Bool *total_brands;
  player *local_168;
  int *local_160;
  int *local_158;
  player_state state;
  
  local_1a0 = nonweap_slay;
  local_168 = (player *)brand_damage;
  local_160 = normal_damage;
  local_158 = slay_damage;
  poVar14 = equipped_item_by_slot_name(player,"shooting");
  _Var7 = tval_is_melee_weapon(obj);
  bVar8 = !throw;
  bVar26 = (player->state).ammo_tval == (uint)obj->tval;
  bVar27 = poVar14 != (object *)0x0;
  local_178 = (player *)poVar14;
  wVar11 = slot_by_name(player,"weapon");
  poVar14 = slot_object(player,wVar11);
  if (_Var7 && bVar8) {
    (player->body).slots[wVar11].obj = obj;
  }
  ppVar5 = player;
  memcpy(&state,&player->state,0x120);
  state.stat_ind[0] = L'\0';
  state.stat_ind[3] = L'\0';
  local_194 = L'\x01';
  calc_bonuses(ppVar5,(player_state_conflict *)&state,true,false);
  (player->body).slots[wVar11].obj = poVar14;
  poVar14 = obj->known;
  if (poVar14->ds == 0 || poVar14->dd == 0) {
    return false;
  }
  bVar18 = (bVar26 && bVar27) && bVar8;
  local_1c4 = (uint)poVar14->dd * (poVar14->ds + 1) * 5;
  wVar11 = object_to_hit(poVar14);
  if (_Var7 && bVar8) {
    local_1c0 = state.to_d * 10;
    wVar12 = object_to_dam(obj->known);
    iVar10 = object_weight_one(obj);
    iVar22 = state.skills[6] * z_info->m_crit_chance_toh_skill_scl +
             (int)player->lev * z_info->m_crit_chance_level_scl +
             (wVar11 + state.to_h) * z_info->m_crit_chance_toh_scl +
             z_info->m_crit_chance_weight_scl * (int)iVar10 + z_info->m_crit_chance_offset;
    iVar13 = z_info->m_crit_chance_range;
    crit_round_add = L'\0';
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    if (iVar13 < iVar22) {
      iVar22 = iVar13;
    }
    crit_div = L'd';
    if ((iVar22 < 1) || (z_info->m_crit_level_head == (critical_level *)0x0)) {
      crit_mult = L'd';
      crit_add = L'\0';
      crit_round_mult = L'\0';
      crit_scl_round = L'\x01';
    }
    else {
      iVar15 = (int)iVar10 * z_info->m_crit_power_weight_scl;
      iVar21 = z_info->m_crit_power_random;
      wVar24 = iVar15 + iVar21 + L'\x01';
      iVar20 = 0;
      iVar16 = 0;
      pcVar3 = z_info->m_crit_level_head;
      wVar11 = iVar15 + L'\x01';
      while (pcVar23 = pcVar3, wVar11 <= iVar15 + iVar21) {
        wVar2 = pcVar23->cutoff;
        pcVar3 = pcVar23->next;
        wVar19 = wVar24;
        if (((iVar15 + iVar21 < wVar2) || (pcVar3 == (critical_level *)0x0)) ||
           (wVar19 = wVar2, wVar11 < wVar2)) {
          iVar20 = iVar20 + (pcVar23->mult + L'\xffffffff') * (wVar19 - wVar11);
          iVar16 = iVar16 + (wVar19 - wVar11) * pcVar23->add;
          wVar11 = wVar19;
        }
      }
      crit_scl_round = iVar21 * (iVar13 / 100);
      crit_round_mult = (iVar20 * iVar22) % crit_scl_round;
      crit_mult = (iVar20 * iVar22) / crit_scl_round + L'd';
      crit_add = (iVar16 * iVar22) / crit_scl_round;
      crit_round_add = (iVar16 * iVar22) % crit_scl_round;
    }
    local_1c8 = wVar12 * 10;
    local_1bc = state.num_blows;
    if (bVar18) {
LAB_0017a783:
      local_194 = (player->state).ammo_mult;
    }
  }
  else {
    state_00 = &player->state;
    iVar10 = object_weight_one(obj);
    if (bVar18) {
      calculate_missile_crits
                ((player_state *)state_00,(int)iVar10,wVar11,true,&crit_mult,&crit_add,&crit_div,
                 &crit_round_mult,&crit_round_add,&crit_scl_round);
      wVar11 = object_to_dam(obj->known);
      wVar12 = object_to_dam(*(object **)&local_178->au);
      local_1c4 = local_1c4 + (wVar12 + wVar11) * 10;
      local_1c0 = 0;
      local_1c8 = 0;
      local_1bc = L'\0';
      goto LAB_0017a783;
    }
    local_1c0 = 0;
    calculate_missile_crits
              ((player_state *)state_00,(int)iVar10,wVar11,false,&crit_mult,&crit_add,&crit_div,
               &crit_round_mult,&crit_round_add,&crit_scl_round);
    wVar11 = object_to_dam(obj->known);
    iVar10 = object_weight_one(obj);
    local_1c4 = (int)(short)(iVar10 / 0xc + 2) * (wVar11 * 10 + local_1c4);
    local_1c8 = 0;
    local_1bc = L'\0';
  }
  total_brands = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  copy_brands(&total_brands,obj->known->brands);
  ppVar5 = local_178;
  if ((bVar26 && bVar27) && bVar8) {
    if (*(object **)&local_178->au != (object *)0x0) {
      copy_brands(&total_brands,(*(object **)&local_178->au)->brands);
    }
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    copy_slays(&total_slays,obj->known->slays);
    poVar14 = *(object **)&ppVar5->au;
    if (poVar14 != (object *)0x0) goto LAB_0017a82d;
  }
  else {
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    poVar14 = obj->known;
LAB_0017a82d:
    copy_slays(&total_slays,poVar14->slays);
  }
  *local_1a0 = false;
  wVar11 = L'\x02';
  if (_Var7 && bVar8) {
    for (; (uint)wVar11 < (uint)(player->body).count; wVar11 = wVar11 + L'\x01') {
      poVar14 = slot_object(player,wVar11);
      if (poVar14 != (object *)0x0) {
        source = poVar14->known->brands;
        if ((source != (_Bool *)0x0) || (poVar14->known->slays != (_Bool *)0x0)) {
          *local_1a0 = true;
          copy_brands(&total_brands,source);
          copy_slays(&total_slays,poVar14->known->slays);
        }
      }
    }
    for (wVar11 = L'\x01'; (uint)wVar11 < (uint)z_info->brand_max; wVar11 = wVar11 + L'\x01') {
      _Var9 = player_has_temporary_brand(player,wVar11);
      if ((_Var9) && (_Var9 = append_brand(&total_brands,wVar11), _Var9)) {
        *local_1a0 = true;
      }
    }
    for (wVar11 = L'\x01'; (uint)wVar11 < (uint)z_info->slay_max; wVar11 = wVar11 + L'\x01') {
      _Var9 = player_has_temporary_slay(player,wVar11);
      if ((_Var9) && (_Var9 = append_slay(&total_slays,wVar11), _Var9)) {
        *local_1a0 = true;
      }
    }
  }
  ppVar5 = player;
  paVar4 = z_info;
  bVar1 = z_info->brand_max;
  iVar13 = ((throw || bVar26 && bVar27) - 1) + local_194;
  iVar15 = crit_add * 10;
  iVar21 = crit_round_add * 10;
  iVar22 = (crit_div + L'\x01') / 2;
  local_1a0 = (_Bool *)CONCAT44(local_1a0._4_4_,iVar22);
  local_178 = player;
  piVar17 = &brands[1].multiplier;
  _Var9 = false;
  for (uVar25 = 1; ppVar6 = player, uVar25 < bVar1; uVar25 = uVar25 + 1) {
    if (total_brands[uVar25] == true) {
      iVar16 = (*piVar17 + iVar13) * local_1c4 + local_1c8;
      iVar16 = (iVar16 * crit_round_mult + iVar21) / crit_scl_round + iVar16 * crit_mult + iVar15;
      iVar20 = iVar16 % crit_div;
      iVar16 = iVar16 / crit_div + local_1c0;
      if (_Var7 && bVar8) {
        iVar20 = (iVar20 * local_1bc) / crit_div + iVar16 * local_1bc;
        iVar16 = iVar20 / 100;
        iVar20 = iVar20 % 100;
        bVar28 = SBORROW4(iVar20,0x32);
        iVar20 = iVar20 + -0x32;
LAB_0017a9c6:
        bVar28 = bVar28 == iVar20 < 0;
      }
      else {
        if (bVar18) {
          wVar11 = (ppVar5->state).num_shots;
          iVar20 = (iVar20 * wVar11) / crit_div + iVar16 * wVar11;
          iVar16 = iVar20 / 10;
          iVar20 = iVar20 % 10;
          bVar28 = SBORROW4(iVar20,5);
          iVar20 = iVar20 + -5;
          goto LAB_0017a9c6;
        }
        bVar28 = iVar22 < iVar20;
      }
      *(uint *)((long)local_168 + uVar25 * 4) = (uint)bVar28 + iVar16;
      _Var9 = true;
    }
    piVar17 = piVar17 + 0xe;
  }
  bVar1 = paVar4->slay_max;
  local_168 = player;
  piVar17 = &slays[1].multiplier;
  for (uVar25 = 1; uVar25 < bVar1; uVar25 = uVar25 + 1) {
    if (total_slays[uVar25] == true) {
      iVar16 = (*piVar17 + iVar13) * local_1c4 + local_1c8;
      iVar16 = (iVar16 * crit_round_mult + iVar21) / crit_scl_round + iVar16 * crit_mult + iVar15;
      iVar20 = iVar16 % crit_div;
      iVar16 = iVar16 / crit_div + local_1c0;
      if (_Var7 && bVar8) {
        iVar20 = (iVar20 * local_1bc) / crit_div + iVar16 * local_1bc;
        iVar16 = iVar20 / 100;
        iVar20 = iVar20 % 100;
        bVar28 = SBORROW4(iVar20,0x32);
        iVar20 = iVar20 + -0x32;
LAB_0017aab9:
        bVar28 = bVar28 == iVar20 < 0;
      }
      else {
        if (bVar18) {
          wVar11 = (ppVar6->state).num_shots;
          iVar20 = (iVar20 * wVar11) / crit_div + iVar16 * wVar11;
          iVar16 = iVar20 / 10;
          iVar20 = iVar20 % 10;
          bVar28 = SBORROW4(iVar20,5);
          iVar20 = iVar20 + -5;
          goto LAB_0017aab9;
        }
        bVar28 = iVar22 <= iVar20;
      }
      local_158[uVar25] = (uint)bVar28 + iVar16;
      _Var9 = true;
    }
    piVar17 = piVar17 + 0x10;
  }
  local_1c8 = local_194 * local_1c4 + local_1c8;
  iVar13 = (iVar21 + crit_round_mult * local_1c8) / crit_scl_round + iVar15 + crit_mult * local_1c8;
  iVar21 = iVar13 % crit_div;
  local_1c0 = iVar13 / crit_div + local_1c0;
  if (_Var7 && bVar8) {
    iVar13 = (iVar21 * local_1bc) / crit_div + local_1c0 * local_1bc;
    local_1c0 = iVar13 / 100;
    iVar13 = iVar13 % 100;
    bVar8 = SBORROW4(iVar13,0x32);
    iVar13 = iVar13 + -0x32;
  }
  else {
    if ((!bVar26 || !bVar27) || !bVar8) {
      bVar8 = iVar22 < iVar21;
      goto LAB_0017abf6;
    }
    wVar11 = (player->state).num_shots;
    iVar13 = (iVar21 * wVar11) / crit_div + local_1c0 * wVar11;
    local_1c0 = iVar13 / 10;
    iVar13 = iVar13 % 10;
    bVar8 = SBORROW4(iVar13,5);
    iVar13 = iVar13 + -5;
  }
  bVar8 = bVar8 == iVar13 < 0;
LAB_0017abf6:
  *local_160 = (uint)bVar8 + local_1c0;
  mem_free(total_brands);
  mem_free(total_slays);
  return _Var9;
}

Assistant:

bool obj_known_damage(const struct object *obj, int *normal_damage,
							 int *brand_damage, int *slay_damage,
							 bool *nonweap_slay, bool throw)
{
	int i;
	int dice, sides, dam, total_dam, plus = 0;
	int xtra_postcrit = 0, xtra_precrit = 0;
	int crit_mult, crit_div, crit_add;
	int crit_round_mult, crit_round_add, crit_scl_round;
	int temp0, temp1, round;
	int old_blows = 0;
	bool *total_brands;
	bool *total_slays;
	bool has_brands_or_slays = false;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	bool weapon = tval_is_melee_weapon(obj) && !throw;
	bool ammo   = (player->state.ammo_tval == obj->tval) && (bow) && !throw;
	int melee_adj_mult = (ammo || throw) ? 0 : 1;
	int multiplier = 1;

	struct player_state state;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);

	/* Pretend we're wielding the object if it's a weapon */
	if (weapon)
		player->body.slots[weapon_slot].obj = (struct object *) obj;

	/* Calculate the player's hypothetical state */
	memcpy(&state, &player->state, sizeof(state));
	state.stat_ind[STAT_STR] = 0; //Hack - NRM
	state.stat_ind[STAT_DEX] = 0; //Hack - NRM
	calc_bonuses(player, &state, true, false);

	/* Stop pretending */
	player->body.slots[weapon_slot].obj = current_weapon;

	/* Finish if dice not known */
	dice = obj->known->dd;
	sides = obj->known->ds;
	if (!dice || !sides) return false;

	/* Calculate damage */
	dam = ((sides + 1) * dice * 5);

	plus += object_to_hit(obj->known);
	if (weapon)	{
		xtra_postcrit = state.to_d * 10;
		xtra_precrit += object_to_dam(obj->known) * 10;

		calculate_melee_crits(&state, object_weight_one(obj), plus,
			&crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		old_blows = state.num_blows;
	} else if (ammo) {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, true, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam += (object_to_dam(bow->known) * 10);
	} else {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, false, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam *= 2 + object_weight_one(obj) / 12;
	}

	if (ammo) multiplier = player->state.ammo_mult;

	/* Get the brands */
	total_brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	copy_brands(&total_brands, obj->known->brands);
	if (ammo && bow->known)
		copy_brands(&total_brands, bow->known->brands);

	/* Get the slays */
	total_slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	copy_slays(&total_slays, obj->known->slays);
	if (ammo && bow->known)
		copy_slays(&total_slays, bow->known->slays);

	/*
	 * Melee weapons may get slays and brands from other items or from
	 * temporary effects.
	 */
	*nonweap_slay = false;
	if (weapon)	{
		for (i = 2; i < player->body.count; i++) {
			struct object *slot_obj = slot_object(player, i);
			if (!slot_obj)
				continue;

			if (slot_obj->known->brands || slot_obj->known->slays)
				*nonweap_slay = true;
			else
				continue;

			/* Replace the old lists with new ones */
			copy_brands(&total_brands, slot_obj->known->brands);
			copy_slays(&total_slays, slot_obj->known->slays);
		}

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_has_temporary_brand(player, i)
					&& append_brand(&total_brands, i)) {
				*nonweap_slay = true;
			}
		}

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_has_temporary_slay(player, i)
					&& append_slay(&total_slays, i)) {
				*nonweap_slay = true;
			}
		}
	}

	/* Get damage for each brand that is active */
	for (i = 1; i < z_info->brand_max; i++) {
		if (!total_brands[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and brand in stated average */
		temp0 = dam * (multiplier + brands[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
		}

		brand_damage[i] = total_dam;
	}

	/* Get damage for each slay that is active */
	for (i = 1; i < z_info->slay_max; i++) {
		if (!total_slays[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and slay in stated average */
		temp0 = dam * (multiplier + slays[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round >= (crit_div + 1) / 2) ? 1 : 0;
		}

		slay_damage[i] = total_dam;
	}

	/* Include bonus damage in stated average */
	temp0 = dam * multiplier + xtra_precrit;
	temp1 = temp0 * crit_mult + 10 * crit_add
		+ (temp0 * crit_round_mult + 10 * crit_round_add)
		/ crit_scl_round;
	total_dam = temp1 / crit_div + xtra_postcrit;
	round = temp1 % crit_div;

	/* Normal damage, not considering brands or slays */
	if (weapon) {
		temp0 = total_dam * old_blows
			+ (round * old_blows) / crit_div;
		total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
	} else if (ammo) {
		temp0 = total_dam * player->state.num_shots
			+ (round * player->state.num_shots) / crit_div;
		total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
	} else {
		total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
	}

	*normal_damage = total_dam;

	mem_free(total_brands);
	mem_free(total_slays);
	return has_brands_or_slays;
}